

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 CalcWindowAutoFitSize(ImGuiWindow *window,ImVec2 *size_contents)

{
  ImVec2 mx;
  ImGuiViewport *pIVar1;
  float *in_RSI;
  long in_RDI;
  bool bVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  ImVec2 window_00;
  ImVec2 IVar6;
  bool will_have_scrollbar_y;
  bool will_have_scrollbar_x;
  ImVec2 size_auto_fit_after_constraint;
  ImVec2 avail_size;
  ImVec2 size_min;
  bool is_menu;
  bool is_popup;
  ImVec2 size_desired;
  ImVec2 size_pad;
  ImVec2 size_decorations;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImVec2 size_auto_fit;
  undefined6 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2e;
  undefined1 in_stack_ffffffffffffff2f;
  ImVec2 *in_stack_ffffffffffffff30;
  ImVec2 *in_stack_ffffffffffffff38;
  ImGuiWindow *in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff48;
  float local_98;
  float fStack_94;
  ImVec2 local_6c;
  ImVec2 local_64;
  ImVec2 local_5c;
  undefined1 local_52;
  undefined1 local_51;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImGuiStyle *local_28;
  ImGuiContext *local_20;
  float *local_18;
  long local_10;
  ImVec2 local_8;
  
  local_20 = GImGui;
  local_28 = &GImGui->Style;
  local_18 = in_RSI;
  local_10 = in_RDI;
  fVar4 = ImGuiWindow::TitleBarHeight(in_stack_ffffffffffffff40);
  fVar5 = ImGuiWindow::MenuBarHeight(in_stack_ffffffffffffff40);
  ImVec2::ImVec2(&local_30,0.0,fVar4 + fVar5);
  local_38 = operator*((ImVec2 *)
                       CONCAT17(in_stack_ffffffffffffff2f,
                                CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)),0.0);
  local_48 = operator+((ImVec2 *)
                       CONCAT17(in_stack_ffffffffffffff2f,
                                CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)),
                       (ImVec2 *)0x15e4a5);
  local_40 = operator+((ImVec2 *)
                       CONCAT17(in_stack_ffffffffffffff2f,
                                CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)),
                       (ImVec2 *)0x15e4c0);
  if ((*(uint *)(local_10 + 0xc) & 0x2000000) == 0) {
    local_51 = (*(uint *)(local_10 + 0xc) & 0x4000000) != 0;
    local_52 = (*(uint *)(local_10 + 0xc) & 0x10000000) != 0;
    local_5c = local_28->WindowMinSize;
    if (((bool)local_51) || ((bool)local_52)) {
      in_stack_ffffffffffffff38 = &local_6c;
      ImVec2::ImVec2(in_stack_ffffffffffffff38,4.0,4.0);
      local_64 = ImMin(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
      local_5c = local_64;
    }
    pIVar1 = ImGui::GetMainViewport();
    IVar6 = pIVar1->Size;
    operator*((ImVec2 *)
              CONCAT17(in_stack_ffffffffffffff2f,
                       CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)),0.0);
    operator-((ImVec2 *)
              CONCAT17(in_stack_ffffffffffffff2f,
                       CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)),
              (ImVec2 *)0x15e5f6);
    window_00 = ImMax(in_stack_ffffffffffffff38,&local_5c);
    mx.y = fVar4;
    mx.x = in_stack_ffffffffffffff48;
    local_8 = ImClamp((ImVec2 *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,mx);
    IVar6 = CalcWindowSizeAfterConstraint((ImGuiWindow *)window_00,IVar6);
    local_98 = IVar6.x;
    if (((*local_18 <= (local_98 - local_38.x) - local_30.x) ||
        ((*(uint *)(local_10 + 0xc) & 8) != 0)) ||
       (bVar2 = true, (*(uint *)(local_10 + 0xc) & 0x800) == 0)) {
      bVar2 = (*(uint *)(local_10 + 0xc) & 0x8000) != 0;
    }
    fStack_94 = IVar6.y;
    if ((local_18[1] <= (fStack_94 - local_38.y) - local_30.y) ||
       (bVar3 = true, (*(uint *)(local_10 + 0xc) & 8) != 0)) {
      bVar3 = (*(uint *)(local_10 + 0xc) & 0x4000) != 0;
    }
    if (bVar2) {
      local_8.y = local_28->ScrollbarSize + local_8.y;
    }
    if (bVar3) {
      local_8.x = local_28->ScrollbarSize + local_8.x;
    }
  }
  else {
    ImVec2::ImVec2(&local_50,1.5,0.0);
    local_8 = operator+((ImVec2 *)
                        CONCAT17(in_stack_ffffffffffffff2f,
                                 CONCAT16(in_stack_ffffffffffffff2e,in_stack_ffffffffffffff28)),
                        (ImVec2 *)0x15e50d);
  }
  return local_8;
}

Assistant:

static ImVec2 CalcWindowAutoFitSize(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImVec2 size_decorations = ImVec2(0.0f, window->TitleBarHeight() + window->MenuBarHeight());
    ImVec2 size_pad = window->WindowPadding * 2.0f;
    ImVec2 size_desired = size_contents + size_pad + size_decorations;
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_desired + ImVec2(1.5f, 0.0f);
    }
    else
    {
        // Maximum window size is determined by the viewport size or monitor size
        const bool is_popup = (window->Flags & ImGuiWindowFlags_Popup) != 0;
        const bool is_menu = (window->Flags & ImGuiWindowFlags_ChildMenu) != 0;
        ImVec2 size_min = style.WindowMinSize;
        if (is_popup || is_menu) // Popups and menus bypass style.WindowMinSize by default, but we give then a non-zero minimum size to facilitate understanding problematic cases (e.g. empty popups)
            size_min = ImMin(size_min, ImVec2(4.0f, 4.0f));

        // FIXME-VIEWPORT-WORKAREA: May want to use GetWorkSize() instead of Size depending on the type of windows?
        ImVec2 avail_size = ImGui::GetMainViewport()->Size;
        ImVec2 size_auto_fit = ImClamp(size_desired, size_min, ImMax(size_min, avail_size - style.DisplaySafeAreaPadding * 2.0f));

        // When the window cannot fit all contents (either because of constraints, either because screen is too small),
        // we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than ViewportSize-WindowPadding.
        ImVec2 size_auto_fit_after_constraint = CalcWindowSizeAfterConstraint(window, size_auto_fit);
        bool will_have_scrollbar_x = (size_auto_fit_after_constraint.x - size_pad.x - size_decorations.x < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysHorizontalScrollbar);
        bool will_have_scrollbar_y = (size_auto_fit_after_constraint.y - size_pad.y - size_decorations.y < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysVerticalScrollbar);
        if (will_have_scrollbar_x)
            size_auto_fit.y += style.ScrollbarSize;
        if (will_have_scrollbar_y)
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}